

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention::forward_int8
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  uint _h_00;
  Mat *blob;
  Mat *this_00;
  size_t sVar1;
  int j;
  uint _w;
  uint _w_00;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  float *pfVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  Mat *blob_00;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  long lVar19;
  Mat *blob_01;
  ulong uVar20;
  void *pvVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Mat m;
  Mat m_1;
  float xkm_int8_scale;
  float v_blob_int8_scale;
  float k_blob_int8_scale;
  float q_blob_int8_scale;
  long local_4f8;
  ulong local_4f0;
  void *local_4d8;
  Mat local_4c8;
  Mat local_478;
  float local_428;
  float local_424;
  float local_420;
  float local_41c;
  int *local_418;
  long *local_410;
  long local_408;
  int local_3fc;
  Mat local_3f8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  Mat local_398;
  Mat local_348;
  Mat local_2f8;
  Mat local_2a8;
  Mat local_258;
  long local_208;
  void *local_200;
  Mat local_1f8;
  Mat local_1a8;
  Mat local_158;
  Mat local_108;
  Mat local_b8;
  Mat *local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  long local_40;
  long local_38;
  
  blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start;
  lVar4 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)blob;
  blob_01 = blob;
  if (lVar4 != 0x48) {
    lVar19 = 0;
    if (this->attn_mask == 0) {
      lVar19 = 0x48;
    }
    if (lVar4 != 0x90) {
      lVar19 = 0x48;
    }
    blob_01 = (Mat *)((long)&blob->data + lVar19);
  }
  blob_00 = blob;
  if ((lVar4 != 0x48) && (this->attn_mask == 0 || lVar4 != 0x90)) {
    blob_00 = blob_01;
    if (this->attn_mask == 0) {
      blob_00 = blob + 2;
    }
    if (lVar4 != 0xd8) {
      blob_00 = blob + 2;
    }
    if (lVar4 == 0x90) {
      blob_00 = blob_01;
    }
  }
  if (this->attn_mask == 0) {
    local_4d8 = (void *)0x0;
    local_418 = (int *)0x0;
    lVar19 = 0;
    local_410 = (long *)0x0;
    local_3fc = 0;
    iVar2 = 0;
    local_3a0 = 0;
  }
  else {
    local_4d8 = *(void **)((long)blob + lVar4 + -0x48);
    local_418 = *(int **)((long)blob + lVar4 + -0x40);
    lVar19 = *(long *)((long)blob + lVar4 + -0x38);
    local_410 = *(long **)((long)blob + lVar4 + -0x28);
    local_3fc = *(int *)((long)blob + lVar4 + -0x20);
    iVar2 = *(int *)((long)blob + lVar4 + -0x1c);
    local_3a0 = *(long *)((long)blob + lVar4 + -8);
    if (local_418 != (int *)0x0) {
      LOCK();
      *local_418 = *local_418 + 1;
      UNLOCK();
    }
  }
  _h = blob->h;
  uVar15 = (ulong)_h;
  _h_00 = blob_01->h;
  uVar16 = (ulong)_h_00;
  _w = this->embed_dim / this->num_heads;
  _w_00 = this->weight_data_size / this->embed_dim;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,_w_00,_h,4,opt->blob_allocator);
  iVar14 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108.elemsize._4_4_ = 0;
    local_108.elempack = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    Mat::create(&local_108,_w,_h,this->num_heads,4,opt->workspace_allocator);
    iVar14 = -100;
    if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      Mat::create(&local_b8,_w,_h_00,this->num_heads,4,opt->workspace_allocator);
      iVar14 = -100;
      if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
        local_158.cstep = 0;
        local_158.data = (void *)0x0;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.elemsize._0_4_ = 0;
        local_158.elemsize._4_4_ = 0;
        local_158.elempack = 0;
        local_158.allocator = (Allocator *)0x0;
        local_158.dims = 0;
        local_158.w = 0;
        local_158.h = 0;
        local_158.d = 0;
        local_158.c = 0;
        Mat::create(&local_158,_h_00,_w,this->num_heads,4,opt->workspace_allocator);
        iVar14 = -100;
        if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
          local_258.cstep = 0;
          local_258.data = (void *)0x0;
          local_258.refcount._0_4_ = 0;
          local_258.refcount._4_4_ = 0;
          local_258.elemsize._0_4_ = 0;
          local_258.elemsize._4_4_ = 0;
          local_258.elempack = 0;
          local_258.allocator = (Allocator *)0x0;
          local_258.dims = 0;
          local_258.w = 0;
          local_258.h = 0;
          local_258.d = 0;
          local_258.c = 0;
          Mat::create(&local_258,_h_00,_h,this->num_heads,4,opt->workspace_allocator);
          iVar14 = -100;
          if ((local_258.data != (void *)0x0) && ((long)local_258.c * local_258.cstep != 0)) {
            local_1a8.cstep = 0;
            local_1a8.data = (void *)0x0;
            local_1a8.refcount._0_4_ = 0;
            local_1a8.refcount._4_4_ = 0;
            local_1a8.elemsize._0_4_ = 0;
            local_1a8.elemsize._4_4_ = 0;
            local_1a8.elempack = 0;
            local_1a8.allocator = (Allocator *)0x0;
            local_1a8.dims = 0;
            local_1a8.w = 0;
            local_1a8.h = 0;
            local_1a8.d = 0;
            local_1a8.c = 0;
            Mat::create(&local_1a8,_w,this->num_heads,_h,4,opt->workspace_allocator);
            iVar14 = -100;
            if ((local_1a8.data != (void *)0x0) && ((long)local_1a8.c * local_1a8.cstep != 0)) {
              local_1f8.cstep = 0;
              local_1f8.data = (void *)0x0;
              local_1f8.refcount._0_4_ = 0;
              local_1f8.refcount._4_4_ = 0;
              local_1f8.elemsize._0_4_ = 0;
              local_1f8.elemsize._4_4_ = 0;
              local_1f8.elempack = 0;
              local_1f8.allocator = (Allocator *)0x0;
              local_1f8.dims = 0;
              local_1f8.w = 0;
              local_1f8.h = 0;
              local_1f8.d = 0;
              local_1f8.c = 0;
              local_68 = this_00;
              dynamic_quantize_2d(blob,&local_1f8,&local_41c,opt);
              local_2f8.cstep = 0;
              local_2f8.data = (void *)0x0;
              local_2f8.refcount._0_4_ = 0;
              local_2f8.refcount._4_4_ = 0;
              local_2f8.elemsize._0_4_ = 0;
              local_2f8.elemsize._4_4_ = 0;
              local_2f8.elempack = 0;
              local_2f8.allocator = (Allocator *)0x0;
              local_2f8.dims = 0;
              local_2f8.w = 0;
              local_2f8.h = 0;
              local_2f8.d = 0;
              local_2f8.c = 0;
              if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start == 0x48) {
                piVar6 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                local_2f8.data = local_1f8.data;
                local_2f8.refcount._0_4_ = local_1f8.refcount._0_4_;
                local_2f8.refcount._4_4_ = local_1f8.refcount._4_4_;
                local_2f8.elemsize._0_4_ = (undefined4)local_1f8.elemsize;
                local_2f8.elemsize._4_4_ = local_1f8.elemsize._4_4_;
                local_2f8.elempack = local_1f8.elempack;
                local_2f8.allocator = local_1f8.allocator;
                local_2f8.dims = local_1f8.dims;
                local_2f8.w = local_1f8.w;
                local_2f8.h = local_1f8.h;
                local_2f8.d = local_1f8.d;
                local_2f8.c = local_1f8.c;
                local_2f8.cstep = local_1f8.cstep;
                local_420 = local_41c;
              }
              else {
                dynamic_quantize_2d(blob_01,&local_2f8,&local_420,opt);
              }
              local_3f8.cstep = 0;
              local_3f8.data = (void *)0x0;
              local_3f8.refcount._0_4_ = 0;
              local_3f8.refcount._4_4_ = 0;
              local_3f8.elemsize._0_4_ = 0;
              local_3f8.elemsize._4_4_ = 0;
              local_3f8.elempack = 0;
              local_3f8.allocator = (Allocator *)0x0;
              local_3f8.dims = 0;
              local_3f8.w = 0;
              local_3f8.h = 0;
              local_3f8.d = 0;
              local_3f8.c = 0;
              lVar4 = ((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
              if (lVar4 == 2) {
                piVar6 = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                local_3f8.data = local_2f8.data;
                local_3f8.refcount._0_4_ = local_2f8.refcount._0_4_;
                local_3f8.refcount._4_4_ = local_2f8.refcount._4_4_;
                local_3f8.elemsize._0_4_ = (undefined4)local_2f8.elemsize;
                local_3f8.elemsize._4_4_ = local_2f8.elemsize._4_4_;
                local_3f8.elempack = local_2f8.elempack;
                local_3f8.allocator = local_2f8.allocator;
                local_3f8.dims = local_2f8.dims;
                local_3f8.w = local_2f8.w;
                local_3f8.h = local_2f8.h;
                local_3f8.d = local_2f8.d;
                local_3f8.c = local_2f8.c;
                local_3f8.cstep = local_2f8.cstep;
                local_424 = local_420;
              }
              else if (lVar4 == 1) {
                piVar6 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + 1;
                  UNLOCK();
                }
                local_3f8.data = local_1f8.data;
                local_3f8.refcount._0_4_ = local_1f8.refcount._0_4_;
                local_3f8.refcount._4_4_ = local_1f8.refcount._4_4_;
                local_3f8.elemsize._0_4_ = (undefined4)local_1f8.elemsize;
                local_3f8.elemsize._4_4_ = local_1f8.elemsize._4_4_;
                local_3f8.elempack = local_1f8.elempack;
                local_3f8.allocator = local_1f8.allocator;
                local_3f8.dims = local_1f8.dims;
                local_3f8.w = local_1f8.w;
                local_3f8.h = local_1f8.h;
                local_3f8.d = local_1f8.d;
                local_3f8.c = local_1f8.c;
                local_3f8.cstep = local_1f8.cstep;
                local_424 = local_41c;
              }
              else {
                dynamic_quantize_2d(blob_00,&local_3f8,&local_424,opt);
              }
              if (0 < this->num_heads) {
                local_3a0 = local_3a0 * lVar19;
                local_38 = (long)(int)_w_00;
                local_3b0 = (long)(int)_w;
                uVar20 = (ulong)_w;
                local_60 = local_3b0 * local_38;
                local_58 = iVar2 * lVar19;
                local_3a8 = 0;
                local_208 = 0;
                local_4f8 = 0;
                do {
                  pvVar21 = local_258.data;
                  if (0 < (int)_h) {
                    pvVar9 = (this->q_bias_data).data;
                    pvVar17 = (this->q_weight_data_int8_scales).data;
                    local_408 = (long)(this->q_weight_data).data + local_208;
                    uVar18 = 0;
                    pvVar10 = local_1f8.data;
                    do {
                      if (0 < (int)_w) {
                        uVar7 = 0;
                        lVar4 = local_408;
                        do {
                          if ((int)_w_00 < 1) {
                            fVar23 = 0.0;
                          }
                          else {
                            lVar19 = 0;
                            iVar2 = 0;
                            do {
                              iVar2 = iVar2 + (int)*(char *)(lVar4 + lVar19) *
                                              (int)*(char *)((long)pvVar10 + lVar19);
                              lVar19 = lVar19 + 1;
                            } while (_w_00 != (uint)lVar19);
                            fVar23 = (float)iVar2;
                          }
                          lVar19 = uVar7 + local_4f8 * local_3b0;
                          *(float *)((long)local_108.data +
                                    uVar7 * 4 +
                                    (long)local_108.w *
                                    CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize
                                            ) * uVar18 +
                                    local_108.cstep * local_4f8 *
                                    CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize
                                            )) =
                               (fVar23 / (*(float *)((long)pvVar17 + lVar19 * 4) * local_41c) +
                               *(float *)((long)pvVar9 + lVar19 * 4)) * this->scale;
                          uVar7 = uVar7 + 1;
                          lVar4 = lVar4 + local_38;
                        } while (uVar7 != uVar20);
                      }
                      uVar18 = uVar18 + 1;
                      pvVar10 = (void *)((long)pvVar10 +
                                        (long)local_1f8.w *
                                        CONCAT44(local_1f8.elemsize._4_4_,
                                                 (undefined4)local_1f8.elemsize));
                    } while (uVar18 != uVar15);
                  }
                  if (0 < (long)local_2f8.h) {
                    pfVar8 = (float *)(local_b8.cstep * local_4f8 *
                                       CONCAT44(local_b8.elemsize._4_4_,
                                                (undefined4)local_b8.elemsize) + (long)local_b8.data
                                      );
                    iVar2 = this->kdim;
                    pvVar9 = (this->k_weight_data_int8_scales).data;
                    pvVar17 = (this->k_bias_data).data;
                    local_408 = (long)local_2f8.w *
                                CONCAT44(local_2f8.elemsize._4_4_,(undefined4)local_2f8.elemsize);
                    local_200 = (void *)(local_3a8 * iVar2 + (long)(this->k_weight_data).data);
                    lVar4 = 0;
                    pvVar10 = local_2f8.data;
                    do {
                      if (0 < (int)_w) {
                        uVar18 = 0;
                        pvVar11 = local_200;
                        do {
                          if (iVar2 < 1) {
                            fVar23 = 0.0;
                          }
                          else {
                            lVar19 = 0;
                            iVar14 = 0;
                            do {
                              iVar14 = iVar14 + (int)*(char *)((long)pvVar11 + lVar19) *
                                                (int)*(char *)((long)pvVar10 + lVar19);
                              lVar19 = lVar19 + 1;
                            } while (iVar2 != (int)lVar19);
                            fVar23 = (float)iVar14;
                          }
                          lVar19 = uVar18 + local_4f8 * local_3b0;
                          *pfVar8 = fVar23 / (local_420 * *(float *)((long)pvVar9 + lVar19 * 4)) +
                                    *(float *)((long)pvVar17 + lVar19 * 4);
                          pfVar8 = pfVar8 + 1;
                          uVar18 = uVar18 + 1;
                          pvVar11 = (void *)((long)pvVar11 + (long)iVar2);
                        } while (uVar18 != uVar20);
                      }
                      lVar4 = lVar4 + 1;
                      pvVar10 = (void *)((long)pvVar10 + local_408);
                    } while (lVar4 != local_2f8.h);
                  }
                  if (0 < (int)_w) {
                    local_200 = (void *)(local_158.cstep * local_4f8 *
                                         CONCAT44(local_158.elemsize._4_4_,
                                                  (undefined4)local_158.elemsize) +
                                        (long)local_158.data);
                    local_40 = (long)local_158.w *
                               CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
                    local_48 = local_3f8.data;
                    iVar2 = this->vdim;
                    local_50 = local_4f8 * local_3b0;
                    pvVar9 = (this->v_weight_data_int8_scales).data;
                    local_408 = (long)iVar2;
                    pvVar10 = (void *)(local_3a8 * local_408 + (long)(this->v_weight_data).data);
                    pvVar17 = (this->v_bias_data).data;
                    local_4f0 = 0;
                    do {
                      if (0 < local_3f8.h) {
                        pfVar8 = (float *)(local_40 * local_4f0 + (long)local_200);
                        uVar18 = 0;
                        pvVar11 = local_3f8.data;
                        do {
                          if (iVar2 < 1) {
                            fVar23 = 0.0;
                          }
                          else {
                            lVar4 = 0;
                            iVar14 = 0;
                            do {
                              iVar14 = iVar14 + (int)*(char *)((long)pvVar10 + lVar4) *
                                                (int)*(char *)((long)pvVar11 + lVar4);
                              lVar4 = lVar4 + 1;
                            } while (iVar2 != (int)lVar4);
                            fVar23 = (float)iVar14;
                          }
                          *pfVar8 = fVar23 / (*(float *)((long)pvVar9 + (local_4f0 + local_50) * 4)
                                             * local_424) +
                                    *(float *)((long)pvVar17 + (local_4f0 + local_50) * 4);
                          pfVar8 = pfVar8 + 1;
                          uVar18 = uVar18 + 1;
                          pvVar11 = (void *)((long)pvVar11 +
                                            (long)local_3f8.w *
                                            CONCAT44(local_3f8.elemsize._4_4_,
                                                     (undefined4)local_3f8.elemsize));
                        } while (uVar18 != (uint)local_3f8.h);
                      }
                      local_4f0 = local_4f0 + 1;
                      pvVar10 = (void *)((long)pvVar10 + local_408);
                    } while (local_4f0 != uVar20);
                  }
                  uVar18 = CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
                  local_4c8.data =
                       (void *)(local_108.cstep * local_4f8 * uVar18 + (long)local_108.data);
                  local_4c8.refcount._0_4_ = 0;
                  local_4c8.refcount._4_4_ = 0;
                  local_4c8.elemsize._0_4_ = (undefined4)local_108.elemsize;
                  local_4c8.elemsize._4_4_ = local_108.elemsize._4_4_;
                  local_4c8.elempack = local_108.elempack;
                  local_4c8.allocator = local_108.allocator;
                  local_4c8.w = local_108.w;
                  local_4c8.h = local_108.h;
                  local_4c8.d = 1;
                  local_4c8.c = local_108.d;
                  local_4c8.dims = local_108.dims + -1;
                  local_4c8.cstep =
                       (uVar18 * (long)local_108.h * (long)local_108.w + 0xf & 0xfffffffffffffff0) /
                       uVar18;
                  if (local_108.dims == 4) {
                    local_4c8.cstep = (long)local_108.h * (long)local_108.w;
                  }
                  uVar18 = CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
                  local_478.data =
                       (void *)(local_b8.cstep * local_4f8 * uVar18 + (long)local_b8.data);
                  local_478.refcount._0_4_ = 0;
                  local_478.refcount._4_4_ = 0;
                  local_478.elemsize._0_4_ = (undefined4)local_b8.elemsize;
                  local_478.elemsize._4_4_ = local_b8.elemsize._4_4_;
                  local_478.elempack = local_b8.elempack;
                  local_478.allocator = local_b8.allocator;
                  local_478.w = local_b8.w;
                  local_478.h = local_b8.h;
                  local_478.d = 1;
                  local_478.c = local_b8.d;
                  local_478.dims = local_b8.dims + -1;
                  local_478.cstep =
                       (uVar18 * (long)local_b8.h * (long)local_b8.w + 0xf & 0xfffffffffffffff0) /
                       uVar18;
                  if (local_b8.dims == 4) {
                    local_478.cstep = (long)local_b8.h * (long)local_b8.w;
                  }
                  lVar12 = (long)local_258.w;
                  lVar5 = local_258.cstep * local_4f8;
                  lVar4 = CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize);
                  local_348.cstep = 0;
                  local_348.data = (void *)0x0;
                  local_348.refcount._0_4_ = 0;
                  local_348.refcount._4_4_ = 0;
                  local_348.elemsize._0_4_ = 0;
                  local_348.elemsize._4_4_ = 0;
                  local_348.elempack = 0;
                  local_348.h = 0;
                  local_348.d = 0;
                  local_348.c = 0;
                  local_348.allocator = (Allocator *)0x0;
                  local_348.dims = 0;
                  local_348.w = 0;
                  local_2a8.cstep = 0;
                  local_2a8.data = (void *)0x0;
                  local_2a8.refcount._0_4_ = 0;
                  local_2a8.refcount._4_4_ = 0;
                  local_2a8.elemsize._0_4_ = 0;
                  local_2a8._20_8_ = 0;
                  local_2a8.h = 0;
                  local_2a8.d = 0;
                  local_2a8.c = 0;
                  local_2a8.allocator = (Allocator *)0x0;
                  local_2a8.dims = 0;
                  local_2a8.w = 0;
                  dynamic_quantize_2d_per_h(&local_4c8,&local_348,&local_2a8,opt);
                  local_398.cstep = 0;
                  local_398.data = (void *)0x0;
                  local_398.refcount._0_4_ = 0;
                  local_398.refcount._4_4_ = 0;
                  local_398.elemsize._0_4_ = 0;
                  local_398.elemsize._4_4_ = 0;
                  local_398.elempack = 0;
                  local_398.h = 0;
                  local_398.d = 0;
                  local_398.c = 0;
                  local_398.allocator = (Allocator *)0x0;
                  local_398.dims = 0;
                  local_398.w = 0;
                  dynamic_quantize_2d(&local_478,&local_398,&local_428,opt);
                  lVar19 = local_58;
                  if (0 < (int)_h) {
                    uVar18 = 0;
                    pvVar9 = local_348.data;
                    do {
                      if (0 < (int)_h_00) {
                        fVar23 = *(float *)((long)local_2a8.data + uVar18 * 4);
                        uVar7 = 0;
                        pvVar17 = local_398.data;
                        do {
                          if ((int)_w < 1) {
                            fVar24 = 0.0;
                          }
                          else {
                            lVar13 = 0;
                            iVar2 = 0;
                            do {
                              iVar2 = iVar2 + (int)*(char *)((long)pvVar17 + lVar13) *
                                              (int)*(char *)((long)pvVar9 + lVar13);
                              lVar13 = lVar13 + 1;
                            } while (_w != (uint)lVar13);
                            fVar24 = (float)iVar2;
                          }
                          *(float *)((long)pvVar21 +
                                    uVar7 * 4 + lVar4 * lVar12 * uVar18 + lVar5 * lVar4) =
                               fVar24 * (1.0 / (fVar23 * local_428));
                          uVar7 = uVar7 + 1;
                          pvVar17 = (void *)((long)pvVar17 +
                                            (long)local_398.w *
                                            CONCAT44(local_398.elemsize._4_4_,
                                                     (undefined4)local_398.elemsize));
                        } while (uVar7 != uVar16);
                      }
                      uVar18 = uVar18 + 1;
                      pvVar9 = (void *)((long)pvVar9 +
                                       (long)local_348.w *
                                       CONCAT44(local_348.elemsize._4_4_,
                                                (undefined4)local_348.elemsize));
                    } while (uVar18 != uVar15);
                  }
                  piVar6 = (int *)CONCAT44(local_398.refcount._4_4_,local_398.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_398.allocator == (Allocator *)0x0) {
                        if (local_398.data != (void *)0x0) {
                          free(local_398.data);
                        }
                      }
                      else {
                        (*(local_398.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_398.cstep = 0;
                  local_398.data = (void *)0x0;
                  local_398.refcount._0_4_ = 0;
                  local_398.refcount._4_4_ = 0;
                  local_398.elemsize._0_4_ = 0;
                  local_398.elemsize._4_4_ = 0;
                  local_398.elempack = 0;
                  local_398.dims = 0;
                  local_398.w = 0;
                  local_398.h = 0;
                  local_398.d = 0;
                  local_398.c = 0;
                  piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_2a8.allocator == (Allocator *)0x0) {
                        if (local_2a8.data != (void *)0x0) {
                          free(local_2a8.data);
                        }
                      }
                      else {
                        (*(local_2a8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_2a8.cstep = 0;
                  local_2a8.data = (void *)0x0;
                  local_2a8.refcount._0_4_ = 0;
                  local_2a8.refcount._4_4_ = 0;
                  local_2a8.elemsize._0_4_ = 0;
                  local_2a8._20_8_ = 0;
                  local_2a8.dims = 0;
                  local_2a8.w = 0;
                  local_2a8.h = 0;
                  local_2a8.d = 0;
                  local_2a8.c = 0;
                  piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,local_348.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_348.allocator == (Allocator *)0x0) {
                        if (local_348.data != (void *)0x0) {
                          free(local_348.data);
                        }
                      }
                      else {
                        (*(local_348.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_348.cstep = 0;
                  local_348.data = (void *)0x0;
                  local_348.refcount._0_4_ = 0;
                  local_348.refcount._4_4_ = 0;
                  local_348.elemsize._0_4_ = 0;
                  local_348.elemsize._4_4_ = 0;
                  local_348.elempack = 0;
                  local_348.dims = 0;
                  local_348.w = 0;
                  local_348.h = 0;
                  local_348.d = 0;
                  local_348.c = 0;
                  piVar6 = (int *)CONCAT44(local_478.refcount._4_4_,local_478.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_478.allocator == (Allocator *)0x0) {
                        if (local_478.data != (void *)0x0) {
                          free(local_478.data);
                        }
                      }
                      else {
                        (*(local_478.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_478.cstep = 0;
                  local_478.data = (void *)0x0;
                  local_478.refcount._0_4_ = 0;
                  local_478.refcount._4_4_ = 0;
                  local_478.elemsize._0_4_ = 0;
                  local_478.elemsize._4_4_ = 0;
                  local_478.elempack = 0;
                  local_478.dims = 0;
                  local_478.w = 0;
                  local_478.h = 0;
                  local_478.d = 0;
                  local_478.c = 0;
                  piVar6 = (int *)CONCAT44(local_4c8.refcount._4_4_,local_4c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_4c8.allocator == (Allocator *)0x0) {
                        if (local_4c8.data != (void *)0x0) {
                          free(local_4c8.data);
                        }
                      }
                      else {
                        (*(local_4c8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_4c8.cstep = 0;
                  local_4c8.data = (void *)0x0;
                  local_4c8.refcount._0_4_ = 0;
                  local_4c8.refcount._4_4_ = 0;
                  local_4c8.elemsize._0_4_ = 0;
                  local_4c8.elemsize._4_4_ = 0;
                  local_4c8.elempack = 0;
                  local_4c8.dims = 0;
                  local_4c8.w = 0;
                  local_4c8.h = 0;
                  local_4c8.d = 0;
                  local_4c8.c = 0;
                  if (this->attn_mask != 0) {
                    if (local_3fc == 3) {
                      piVar6 = (int *)0x0;
                      pvVar21 = (void *)(local_3a0 * local_4f8 + (long)local_4d8);
                    }
                    else {
                      piVar6 = local_418;
                      pvVar21 = local_4d8;
                      if (local_418 != (int *)0x0) {
                        LOCK();
                        *local_418 = *local_418 + 1;
                        UNLOCK();
                      }
                    }
                    if (0 < (int)_h) {
                      pvVar17 = (void *)(CONCAT44(local_258.elemsize._4_4_,
                                                  (undefined4)local_258.elemsize) * local_258.cstep
                                         * local_4f8 + (long)local_258.data);
                      uVar18 = 0;
                      pvVar9 = pvVar21;
                      do {
                        if (0 < (int)_h_00) {
                          uVar7 = 0;
                          do {
                            *(float *)((long)pvVar17 + uVar7 * 4) =
                                 *(float *)((long)pvVar17 + uVar7 * 4) +
                                 *(float *)((long)pvVar9 + uVar7 * 4);
                            uVar7 = uVar7 + 1;
                          } while (uVar16 != uVar7);
                        }
                        uVar18 = uVar18 + 1;
                        pvVar17 = (void *)((long)pvVar17 +
                                          (long)local_258.w *
                                          CONCAT44(local_258.elemsize._4_4_,
                                                   (undefined4)local_258.elemsize));
                        pvVar9 = (void *)((long)pvVar9 + lVar19);
                      } while (uVar18 != uVar15);
                    }
                    if (piVar6 != (int *)0x0) {
                      LOCK();
                      *piVar6 = *piVar6 + -1;
                      UNLOCK();
                      if (*piVar6 == 0) {
                        if (local_410 == (long *)0x0) {
                          if (pvVar21 != (void *)0x0) {
                            free(pvVar21);
                          }
                        }
                        else {
                          (**(code **)(*local_410 + 0x18))();
                        }
                      }
                    }
                  }
                  if (0 < (int)_h) {
                    lVar4 = CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize);
                    lVar19 = (long)local_258.w;
                    pvVar21 = (void *)(lVar4 * local_258.cstep * local_4f8 + (long)local_258.data);
                    uVar18 = 0;
                    do {
                      fVar23 = -3.4028235e+38;
                      if (0 < (int)_h_00) {
                        uVar7 = 0;
                        fVar23 = -3.4028235e+38;
                        do {
                          fVar24 = *(float *)((long)pvVar21 + uVar7 * 4);
                          if (fVar23 <= fVar24) {
                            fVar23 = fVar24;
                          }
                          uVar7 = uVar7 + 1;
                        } while (uVar16 != uVar7);
                      }
                      fVar24 = 0.0;
                      if (0 < (int)_h_00) {
                        uVar7 = 0;
                        do {
                          fVar22 = expf(*(float *)((long)pvVar21 + uVar7 * 4) - fVar23);
                          *(float *)((long)pvVar21 + uVar7 * 4) = fVar22;
                          fVar24 = fVar24 + fVar22;
                          uVar7 = uVar7 + 1;
                        } while (uVar16 != uVar7);
                      }
                      if (0 < (int)_h_00) {
                        uVar7 = 0;
                        do {
                          *(float *)((long)pvVar21 + uVar7 * 4) =
                               *(float *)((long)pvVar21 + uVar7 * 4) * (1.0 / fVar24);
                          uVar7 = uVar7 + 1;
                        } while (uVar16 != uVar7);
                      }
                      uVar18 = uVar18 + 1;
                      pvVar21 = (void *)((long)pvVar21 + lVar19 * lVar4);
                    } while (uVar18 != uVar15);
                  }
                  uVar18 = CONCAT44(local_258.elemsize._4_4_,(undefined4)local_258.elemsize);
                  local_4c8.data =
                       (void *)(local_258.cstep * local_4f8 * uVar18 + (long)local_258.data);
                  local_4c8.refcount._0_4_ = 0;
                  local_4c8.refcount._4_4_ = 0;
                  local_4c8.elemsize._0_4_ = (undefined4)local_258.elemsize;
                  local_4c8.elemsize._4_4_ = local_258.elemsize._4_4_;
                  local_4c8.elempack = local_258.elempack;
                  local_4c8.allocator = local_258.allocator;
                  local_4c8.w = local_258.w;
                  local_4c8.h = local_258.h;
                  local_4c8.d = 1;
                  local_4c8.c = local_258.d;
                  local_4c8.dims = local_258.dims + -1;
                  local_4c8.cstep =
                       (uVar18 * (long)local_258.h * (long)local_258.w + 0xf & 0xfffffffffffffff0) /
                       uVar18;
                  if (local_258.dims == 4) {
                    local_4c8.cstep = (long)local_258.h * (long)local_258.w;
                  }
                  uVar18 = CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
                  local_478.data =
                       (void *)(local_158.cstep * local_4f8 * uVar18 + (long)local_158.data);
                  local_478.refcount._0_4_ = 0;
                  local_478.refcount._4_4_ = 0;
                  local_478.elemsize._0_4_ = (undefined4)local_158.elemsize;
                  local_478.elemsize._4_4_ = local_158.elemsize._4_4_;
                  local_478.elempack = local_158.elempack;
                  local_478.allocator = local_158.allocator;
                  local_478.w = local_158.w;
                  local_478.h = local_158.h;
                  local_478.d = 1;
                  local_478.c = local_158.d;
                  local_478.dims = local_158.dims + -1;
                  local_478.cstep =
                       (uVar18 * (long)local_158.h * (long)local_158.w + 0xf & 0xfffffffffffffff0) /
                       uVar18;
                  if (local_158.dims == 4) {
                    local_478.cstep = (long)local_158.h * (long)local_158.w;
                  }
                  local_348.cstep = 0;
                  local_348.data = (void *)0x0;
                  local_348.refcount._0_4_ = 0;
                  local_348.refcount._4_4_ = 0;
                  local_348.elemsize._0_4_ = 0;
                  local_348.elemsize._4_4_ = 0;
                  local_348.elempack = 0;
                  local_348.h = 0;
                  local_348.d = 0;
                  local_348.c = 0;
                  local_348.allocator = (Allocator *)0x0;
                  local_348.dims = 0;
                  local_348.w = 0;
                  local_2a8.cstep = 0;
                  local_2a8.data = (void *)0x0;
                  local_2a8.refcount._0_4_ = 0;
                  local_2a8.refcount._4_4_ = 0;
                  local_2a8.elemsize._0_4_ = 0;
                  local_2a8._20_8_ = 0;
                  local_2a8.h = 0;
                  local_2a8.d = 0;
                  local_2a8.c = 0;
                  local_2a8.allocator = (Allocator *)0x0;
                  local_2a8.dims = 0;
                  local_2a8.w = 0;
                  dynamic_quantize_2d_per_h(&local_4c8,&local_348,&local_2a8,opt);
                  local_398.cstep = 0;
                  local_398.data = (void *)0x0;
                  local_398.refcount._0_4_ = 0;
                  local_398.refcount._4_4_ = 0;
                  local_398.elemsize._0_4_ = 0;
                  local_398.elemsize._4_4_ = 0;
                  local_398.elempack = 0;
                  local_398.h = 0;
                  local_398.d = 0;
                  local_398.c = 0;
                  local_398.allocator = (Allocator *)0x0;
                  local_398.dims = 0;
                  local_398.w = 0;
                  dynamic_quantize_2d(&local_478,&local_398,&local_428,opt);
                  if (0 < (int)_h) {
                    uVar18 = 0;
                    pvVar21 = local_348.data;
                    do {
                      if (0 < (int)_w) {
                        fVar23 = *(float *)((long)local_2a8.data + uVar18 * 4);
                        uVar7 = 0;
                        pvVar9 = local_398.data;
                        do {
                          if ((int)_h_00 < 1) {
                            fVar24 = 0.0;
                          }
                          else {
                            lVar4 = 0;
                            iVar2 = 0;
                            do {
                              iVar2 = iVar2 + (int)*(char *)((long)pvVar9 + lVar4) *
                                              (int)*(char *)((long)pvVar21 + lVar4);
                              lVar4 = lVar4 + 1;
                            } while (_h_00 != (uint)lVar4);
                            fVar24 = (float)iVar2;
                          }
                          *(float *)((long)local_1a8.data +
                                    uVar7 * 4 +
                                    local_1a8.cstep *
                                    CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize
                                            ) * uVar18 +
                                    local_1a8.w * local_4f8 *
                                    CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize
                                            )) = fVar24 * (1.0 / (fVar23 * local_428));
                          uVar7 = uVar7 + 1;
                          pvVar9 = (void *)((long)pvVar9 +
                                           (long)local_398.w *
                                           CONCAT44(local_398.elemsize._4_4_,
                                                    (undefined4)local_398.elemsize));
                        } while (uVar7 != uVar20);
                      }
                      uVar18 = uVar18 + 1;
                      pvVar21 = (void *)((long)pvVar21 +
                                        (long)local_348.w *
                                        CONCAT44(local_348.elemsize._4_4_,
                                                 (undefined4)local_348.elemsize));
                    } while (uVar18 != uVar15);
                  }
                  piVar6 = (int *)CONCAT44(local_398.refcount._4_4_,local_398.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_398.allocator == (Allocator *)0x0) {
                        if (local_398.data != (void *)0x0) {
                          free(local_398.data);
                        }
                      }
                      else {
                        (*(local_398.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_398.cstep = 0;
                  local_398.data = (void *)0x0;
                  local_398.refcount._0_4_ = 0;
                  local_398.refcount._4_4_ = 0;
                  local_398.elemsize._0_4_ = 0;
                  local_398.elemsize._4_4_ = 0;
                  local_398.elempack = 0;
                  local_398.dims = 0;
                  local_398.w = 0;
                  local_398.h = 0;
                  local_398.d = 0;
                  local_398.c = 0;
                  piVar6 = (int *)CONCAT44(local_2a8.refcount._4_4_,local_2a8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_2a8.allocator == (Allocator *)0x0) {
                        if (local_2a8.data != (void *)0x0) {
                          free(local_2a8.data);
                        }
                      }
                      else {
                        (*(local_2a8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_2a8.cstep = 0;
                  local_2a8.data = (void *)0x0;
                  local_2a8.refcount._0_4_ = 0;
                  local_2a8.refcount._4_4_ = 0;
                  local_2a8.elemsize._0_4_ = 0;
                  local_2a8._20_8_ = 0;
                  local_2a8.dims = 0;
                  local_2a8.w = 0;
                  local_2a8.h = 0;
                  local_2a8.d = 0;
                  local_2a8.c = 0;
                  piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,local_348.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_348.allocator == (Allocator *)0x0) {
                        if (local_348.data != (void *)0x0) {
                          free(local_348.data);
                        }
                      }
                      else {
                        (*(local_348.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_348.cstep = 0;
                  local_348.data = (void *)0x0;
                  local_348.refcount._0_4_ = 0;
                  local_348.refcount._4_4_ = 0;
                  local_348.elemsize._0_4_ = 0;
                  local_348.elemsize._4_4_ = 0;
                  local_348.elempack = 0;
                  local_348.dims = 0;
                  local_348.w = 0;
                  local_348.h = 0;
                  local_348.d = 0;
                  local_348.c = 0;
                  piVar6 = (int *)CONCAT44(local_478.refcount._4_4_,local_478.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_478.allocator == (Allocator *)0x0) {
                        if (local_478.data != (void *)0x0) {
                          free(local_478.data);
                        }
                      }
                      else {
                        (*(local_478.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_478.cstep = 0;
                  local_478.data = (void *)0x0;
                  local_478.refcount._0_4_ = 0;
                  local_478.refcount._4_4_ = 0;
                  local_478.elemsize._0_4_ = 0;
                  local_478.elemsize._4_4_ = 0;
                  local_478.elempack = 0;
                  local_478.dims = 0;
                  local_478.w = 0;
                  local_478.h = 0;
                  local_478.d = 0;
                  local_478.c = 0;
                  piVar6 = (int *)CONCAT44(local_4c8.refcount._4_4_,local_4c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_4c8.allocator == (Allocator *)0x0) {
                        if (local_4c8.data != (void *)0x0) {
                          free(local_4c8.data);
                        }
                      }
                      else {
                        (*(local_4c8.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  local_4f8 = local_4f8 + 1;
                  local_208 = local_208 + local_60;
                  local_3a8 = local_3a8 + local_3b0;
                } while (local_4f8 < this->num_heads);
              }
              local_4c8.cstep = 0;
              local_4c8.data = (void *)0x0;
              local_4c8.refcount._0_4_ = 0;
              local_4c8.refcount._4_4_ = 0;
              local_4c8.elemsize._0_4_ = 0;
              local_4c8.elemsize._4_4_ = 0;
              local_4c8.elempack = 0;
              local_4c8.allocator = (Allocator *)0x0;
              local_4c8.dims = 0;
              local_4c8.w = 0;
              local_4c8.h = 0;
              local_4c8.d = 0;
              local_4c8.c = 0;
              local_478.cstep = 0;
              local_478.data = (void *)0x0;
              local_478.refcount._0_4_ = 0;
              local_478.refcount._4_4_ = 0;
              local_478.elemsize._0_4_ = 0;
              local_478.elemsize._4_4_ = 0;
              local_478.elempack = 0;
              local_478.allocator = (Allocator *)0x0;
              local_478.dims = 0;
              local_478.w = 0;
              local_478.h = 0;
              local_478.d = 0;
              local_478.c = 0;
              Mat::create(&local_4c8,local_1a8.w,local_1a8.h,local_1a8.c,1,1,
                          opt->workspace_allocator);
              Mat::create(&local_478,_h,4,1,opt->workspace_allocator);
              if (0 < (long)local_4c8.c) {
                lVar4 = 0;
                pvVar21 = local_1a8.data;
                do {
                  fVar23 = 0.0;
                  if (0 < local_4c8.h * local_4c8.w) {
                    uVar16 = 0;
                    do {
                      fVar24 = ABS(*(float *)((long)pvVar21 + uVar16 * 4));
                      if (fVar23 <= fVar24) {
                        fVar23 = fVar24;
                      }
                      uVar16 = uVar16 + 1;
                    } while ((uint)(local_4c8.h * local_4c8.w) != uVar16);
                  }
                  *(uint *)((long)local_478.data + lVar4 * 4) =
                       -(uint)(fVar23 == 0.0) & 0x3f800000 |
                       ~-(uint)(fVar23 == 0.0) & (uint)(127.0 / fVar23);
                  lVar4 = lVar4 + 1;
                  pvVar21 = (void *)((long)pvVar21 +
                                    local_1a8.cstep *
                                    CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize
                                            ));
                } while (lVar4 != local_4c8.c);
              }
              if (0 < local_4c8.c) {
                lVar4 = 0;
                do {
                  pvVar9 = local_1a8.data;
                  pvVar21 = local_4c8.data;
                  if (0 < local_4c8.h * local_4c8.w) {
                    lVar12 = CONCAT44(local_4c8.elemsize._4_4_,(undefined4)local_4c8.elemsize) *
                             local_4c8.cstep;
                    lVar5 = CONCAT44(local_1a8.elemsize._4_4_,(undefined4)local_1a8.elemsize) *
                            local_1a8.cstep;
                    lVar19 = 0;
                    do {
                      fVar23 = roundf(*(float *)((long)local_478.data + lVar4 * 4) *
                                      *(float *)((long)pvVar9 + lVar19 * 4 + lVar5 * lVar4));
                      iVar2 = (int)fVar23;
                      if (iVar2 < -0x7e) {
                        iVar2 = -0x7f;
                      }
                      if (0x7e < iVar2) {
                        iVar2 = 0x7f;
                      }
                      *(char *)((long)pvVar21 + lVar19 + lVar12 * lVar4) = (char)iVar2;
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < (long)local_4c8.h * (long)local_4c8.w);
                  }
                  lVar4 = lVar4 + 1;
                } while (lVar4 < local_4c8.c);
              }
              if (0 < (int)_h) {
                pvVar21 = local_68->data;
                iVar2 = local_68->w;
                sVar1 = local_68->elemsize;
                pvVar9 = (this->out_weight_data).data;
                iVar14 = this->embed_dim;
                pvVar17 = (this->out_bias_data).data;
                uVar16 = 0;
                pvVar10 = local_4c8.data;
                do {
                  if (0 < (int)_w_00) {
                    uVar20 = 0;
                    pvVar11 = pvVar9;
                    do {
                      if (iVar14 < 1) {
                        fVar23 = 0.0;
                      }
                      else {
                        lVar4 = 0;
                        iVar3 = 0;
                        do {
                          iVar3 = iVar3 + (int)*(char *)((long)pvVar11 + lVar4) *
                                          (int)*(char *)((long)pvVar10 + lVar4);
                          lVar4 = lVar4 + 1;
                        } while (iVar14 != (int)lVar4);
                        fVar23 = (float)iVar3;
                      }
                      *(float *)((long)pvVar21 + uVar20 * 4 + (long)iVar2 * sVar1 * uVar16) =
                           fVar23 / (*(float *)((long)local_478.data + uVar16 * 4) *
                                    this->out_weight_data_int8_scale) +
                           *(float *)((long)pvVar17 + uVar20 * 4);
                      uVar20 = uVar20 + 1;
                      pvVar11 = (void *)((long)pvVar11 + (long)iVar14);
                    } while (uVar20 != _w_00);
                  }
                  uVar16 = uVar16 + 1;
                  pvVar10 = (void *)((long)pvVar10 +
                                    local_4c8.cstep *
                                    CONCAT44(local_4c8.elemsize._4_4_,(undefined4)local_4c8.elemsize
                                            ));
                } while (uVar16 != uVar15);
              }
              piVar6 = (int *)CONCAT44(local_478.refcount._4_4_,local_478.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_478.allocator == (Allocator *)0x0) {
                    if (local_478.data != (void *)0x0) {
                      free(local_478.data);
                    }
                  }
                  else {
                    (*(local_478.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_478.cstep = 0;
              local_478.data = (void *)0x0;
              local_478.refcount._0_4_ = 0;
              local_478.refcount._4_4_ = 0;
              local_478.elemsize._0_4_ = 0;
              local_478.elemsize._4_4_ = 0;
              local_478.elempack = 0;
              local_478.dims = 0;
              local_478.w = 0;
              local_478.h = 0;
              local_478.d = 0;
              local_478.c = 0;
              piVar6 = (int *)CONCAT44(local_4c8.refcount._4_4_,local_4c8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_4c8.allocator == (Allocator *)0x0) {
                    if (local_4c8.data != (void *)0x0) {
                      free(local_4c8.data);
                    }
                  }
                  else {
                    (*(local_4c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_4c8.cstep = 0;
              local_4c8.data = (void *)0x0;
              local_4c8.refcount._0_4_ = 0;
              local_4c8.refcount._4_4_ = 0;
              local_4c8.elemsize._0_4_ = 0;
              local_4c8.elemsize._4_4_ = 0;
              local_4c8.elempack = 0;
              local_4c8.dims = 0;
              local_4c8.w = 0;
              local_4c8.h = 0;
              local_4c8.d = 0;
              local_4c8.c = 0;
              piVar6 = (int *)CONCAT44(local_3f8.refcount._4_4_,local_3f8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_3f8.allocator == (Allocator *)0x0) {
                    if (local_3f8.data != (void *)0x0) {
                      free(local_3f8.data);
                    }
                  }
                  else {
                    (*(local_3f8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_3f8.cstep = 0;
              local_3f8.data = (void *)0x0;
              local_3f8.refcount._0_4_ = 0;
              local_3f8.refcount._4_4_ = 0;
              local_3f8.elemsize._0_4_ = 0;
              local_3f8.elemsize._4_4_ = 0;
              local_3f8.elempack = 0;
              local_3f8.dims = 0;
              local_3f8.w = 0;
              local_3f8.h = 0;
              local_3f8.d = 0;
              local_3f8.c = 0;
              piVar6 = (int *)CONCAT44(local_2f8.refcount._4_4_,local_2f8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_2f8.allocator == (Allocator *)0x0) {
                    if (local_2f8.data != (void *)0x0) {
                      free(local_2f8.data);
                    }
                  }
                  else {
                    (*(local_2f8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_2f8.cstep = 0;
              local_2f8.data = (void *)0x0;
              local_2f8.refcount._0_4_ = 0;
              local_2f8.refcount._4_4_ = 0;
              local_2f8.elemsize._0_4_ = 0;
              local_2f8.elemsize._4_4_ = 0;
              local_2f8.elempack = 0;
              local_2f8.dims = 0;
              local_2f8.w = 0;
              local_2f8.h = 0;
              local_2f8.d = 0;
              local_2f8.c = 0;
              piVar6 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_1f8.allocator == (Allocator *)0x0) {
                    if (local_1f8.data != (void *)0x0) {
                      free(local_1f8.data);
                    }
                  }
                  else {
                    (*(local_1f8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_1f8.cstep = 0;
              local_1f8.data = (void *)0x0;
              local_1f8.refcount._0_4_ = 0;
              local_1f8.refcount._4_4_ = 0;
              local_1f8.elemsize._0_4_ = 0;
              local_1f8.elemsize._4_4_ = 0;
              local_1f8.elempack = 0;
              local_1f8.dims = 0;
              local_1f8.w = 0;
              local_1f8.h = 0;
              local_1f8.d = 0;
              local_1f8.c = 0;
              iVar14 = 0;
            }
            piVar6 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_1a8.allocator == (Allocator *)0x0) {
                  if (local_1a8.data != (void *)0x0) {
                    free(local_1a8.data);
                  }
                }
                else {
                  (*(local_1a8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_1a8.cstep = 0;
            local_1a8.data = (void *)0x0;
            local_1a8.refcount._0_4_ = 0;
            local_1a8.refcount._4_4_ = 0;
            local_1a8.elemsize._0_4_ = 0;
            local_1a8.elemsize._4_4_ = 0;
            local_1a8.elempack = 0;
            local_1a8.dims = 0;
            local_1a8.w = 0;
            local_1a8.h = 0;
            local_1a8.d = 0;
            local_1a8.c = 0;
          }
          piVar6 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_258.allocator == (Allocator *)0x0) {
                if (local_258.data != (void *)0x0) {
                  free(local_258.data);
                }
              }
              else {
                (*(local_258.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_258.cstep = 0;
          local_258.data = (void *)0x0;
          local_258.refcount._0_4_ = 0;
          local_258.refcount._4_4_ = 0;
          local_258.elemsize._0_4_ = 0;
          local_258.elemsize._4_4_ = 0;
          local_258.elempack = 0;
          local_258.dims = 0;
          local_258.w = 0;
          local_258.h = 0;
          local_258.d = 0;
          local_258.c = 0;
        }
        piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if (local_158.data != (void *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_158.cstep = 0;
        local_158.data = (void *)0x0;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.elemsize._0_4_ = 0;
        local_158.elemsize._4_4_ = 0;
        local_158.elempack = 0;
        local_158.dims = 0;
        local_158.w = 0;
        local_158.h = 0;
        local_158.d = 0;
        local_158.c = 0;
      }
      piVar6 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
    }
    piVar6 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108.elemsize._4_4_ = 0;
    local_108.elempack = 0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
  }
  if (local_418 != (int *)0x0) {
    LOCK();
    *local_418 = *local_418 + -1;
    UNLOCK();
    if (*local_418 == 0) {
      if (local_410 == (long *)0x0) {
        if (local_4d8 != (void *)0x0) {
          free(local_4d8);
        }
      }
      else {
        (**(code **)(*local_410 + 0x18))(local_410,local_4d8);
      }
    }
  }
  return iVar14;
}

Assistant:

int MultiHeadAttention::forward_int8(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;
    const int qdim = weight_data_size / embed_dim;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(qdim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xq.empty())
        return -100;
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xk.empty())
        return -100;
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);
    if (xv.empty())
        return -100;

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    if (xqk.empty())
        return -100;

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);
    if (xqkv.empty())
        return -100;

    // dynamic quantize q_blob
    Mat q_blob_int8;
    float q_blob_int8_scale;
    dynamic_quantize_2d(q_blob, q_blob_int8, q_blob_int8_scale, opt);

    // dynamic quantize k_blob
    Mat k_blob_int8;
    float k_blob_int8_scale;
    if (bottom_blobs.size() == 1)
    {
        k_blob_int8 = q_blob_int8;
        k_blob_int8_scale = q_blob_int8_scale;
    }
    else
    {
        dynamic_quantize_2d(k_blob, k_blob_int8, k_blob_int8_scale, opt);
    }

    // dynamic quantize v_blob
    Mat v_blob_int8;
    float v_blob_int8_scale;
    if (bottom_blobs.size() == 1)
    {
        v_blob_int8 = q_blob_int8;
        v_blob_int8_scale = q_blob_int8_scale;
    }
    else if (bottom_blobs.size() == 2)
    {
        v_blob_int8 = k_blob_int8;
        v_blob_int8_scale = k_blob_int8_scale;
    }
    else
    {
        dynamic_quantize_2d(v_blob, v_blob_int8, v_blob_int8_scale, opt);
    }

    // NCNN_LOGE("%.4f %.4f", q_weight_data_int8_scale, q_blob_int8_scale);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * scale
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* ptr = q_blob_int8.row<const signed char>(i);
                    const signed char* kptr = (const signed char*)q_weight_data + qdim * (q * embed_dim_per_head + j);

                    int sum = 0;
                    for (int k = 0; k < qdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float q_descale = 1.f / (q_weight_data_int8_scales[q * embed_dim_per_head + j] * q_blob_int8_scale);
                    float sum_fp32 = sum * q_descale + q_bias_data[q * embed_dim_per_head + j];

                    outptr[j] = sum_fp32 * scale;
                }
            }
        }

        // xk = affine(k)
        {
            float* outptr = xk.channel(q);

            for (int i = 0; i < k_blob_int8.h; i++)
            {
                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* ptr = k_blob_int8.row<const signed char>(i);
                    const signed char* kptr = (const signed char*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    int sum = 0;
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float k_descale = 1.f / (k_weight_data_int8_scales[q * embed_dim_per_head + j] * k_blob_int8_scale);
                    float sum_fp32 = sum * k_descale + k_bias_data[q * embed_dim_per_head + j];

                    *outptr++ = sum_fp32;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < v_blob_int8.h; j++)
                {
                    const signed char* ptr = v_blob_int8.row<const signed char>(j);
                    const signed char* kptr = (const signed char*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    int sum = 0;
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }
                    const float v_descale = 1.f / (v_weight_data_int8_scales[q * embed_dim_per_head + i] * v_blob_int8_scale);
                    float sum_fp32 = sum * v_descale + v_bias_data[q * embed_dim_per_head + i];

                    *outptr++ = sum_fp32;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            // dynamic quantize xqm per h
            Mat xqm_int8;
            Mat xqm_int8_scales;
            dynamic_quantize_2d_per_h(xqm, xqm_int8, xqm_int8_scales, opt);

            // dynamic quantize xkm
            Mat xkm_int8;
            float xkm_int8_scale;
            dynamic_quantize_2d(xkm, xkm_int8, xkm_int8_scale, opt);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);
                const float xqk_descale = 1.f / (xqm_int8_scales[i] * xkm_int8_scale);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const signed char* qptr = xqm_int8.row<const signed char>(i);
                    const signed char* kptr = xkm_int8.row<const signed char>(j);

                    int sum = 0;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }
                    float sum_fp32 = sum * xqk_descale;

                    outptr[j] = sum_fp32;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            // dynamic quantize xqkm
            Mat xqkm_int8;
            Mat xqkm_int8_scales;
            dynamic_quantize_2d_per_h(xqkm, xqkm_int8, xqkm_int8_scales, opt);

            // dynamic quantize xvm per h
            Mat xvm_int8;
            float xvm_int8_scale;
            dynamic_quantize_2d(xvm, xvm_int8, xvm_int8_scale, opt);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);
                const float xqkv_descale = 1.f / (xqkm_int8_scales[i] * xvm_int8_scale);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const signed char* qkptr = xqkm_int8.row<const signed char>(i);
                    const signed char* vptr = xvm_int8.row<const signed char>(j);

                    int sum = 0;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }
                    float sum_fp32 = sum * xqkv_descale;

                    outptr[j] = sum_fp32;
                }
            }
        }
    }

    // dynamic quantize xqkv
    Mat xqkv_int8;
    Mat xqkv_int8_scales;
    {
        xqkv_int8.create(xqkv.w, xqkv.h, xqkv.c, (size_t)1u, 1, opt.workspace_allocator);
        xqkv_int8_scales.create(src_seqlen, (size_t)4u, 1, opt.workspace_allocator);

        for (int i = 0; i < xqkv_int8.c; i++)
        {
            const float* ptr = xqkv.channel(i);

            float absmax = 0.f;
            for (int j = 0; j < xqkv_int8.w * xqkv_int8.h; j++)
            {
                absmax = std::max(absmax, (float)fabs(ptr[j]));
            }

            xqkv_int8_scales[i] = absmax == 0.f ? 1.f : 127.f / absmax;
        }

        for (int i = 0; i < xqkv_int8.c; i++)
        {
            const float* ptr = xqkv.channel(i);
            signed char* outptr = xqkv_int8.channel(i);

            for (int j = 0; j < xqkv_int8.w * xqkv_int8.h; j++)
            {
                outptr[j] = float2int8(ptr[j] * xqkv_int8_scales[i]);
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < qdim; j++)
        {
            const signed char* ptr = xqkv_int8.channel(i);
            const signed char* kptr = (const signed char*)out_weight_data + embed_dim * j;

            int sum = 0;
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }
            const float out_descale = 1.f / (out_weight_data_int8_scale * xqkv_int8_scales[i]);
            float sum_fp32 = sum * out_descale + out_bias_data[j];

            outptr[j] = sum_fp32;
        }
    }

    return 0;
}